

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSDDOMParser::docCharacters
          (XSDDOMParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  XMLSize_t XVar1;
  XMLCh XVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  XMLBuffer *pXVar5;
  XMLCh XVar6;
  XMLCh *chars_00;
  ulong uVar7;
  bool bVar8;
  LastExtEntityInfo lastInfo;
  LastExtEntityInfo local_50;
  
  if ((this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement == true) {
    if (this->fInnerAnnotationDepth == -1) {
      bVar8 = XMLReader::isAllSpaces
                        ((((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                         fReaderMgr).fCurReader,chars,length);
      if (!bVar8) {
        ReaderMgr::getLastExtEntityInfo
                  (&((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fReaderMgr,
                   &local_50);
        XSDLocator::setValues
                  (&this->fXSLocator,local_50.systemId,local_50.publicId,local_50.lineNumber,
                   local_50.colNumber);
        XSDErrorReporter::emitError
                  (&this->fXSDErrorReporter,0x49,L"http://apache.org/xml/messages/XMLValidity",
                   &(this->fXSLocator).super_Locator);
      }
    }
    else {
      if (cdataSection) {
        pXVar5 = &this->fAnnotationBuf;
        XMLBuffer::append(pXVar5,(XMLCh *)XMLUni::fgCDataStart);
        XMLBuffer::append(pXVar5,chars,length);
        XMLBuffer::append(pXVar5,L"]]>");
        return;
      }
      if (length != 0) {
        pXVar5 = &this->fAnnotationBuf;
        uVar3 = 0;
        uVar7 = 1;
        do {
          XVar6 = chars[uVar3];
          XVar4 = (this->fAnnotationBuf).fIndex;
          XVar1 = (this->fAnnotationBuf).fCapacity;
          if (XVar6 == L'<') {
            if (XVar4 == XVar1) {
              XMLBuffer::ensureCapacity(pXVar5,1);
              XVar4 = pXVar5->fIndex;
            }
            (this->fAnnotationBuf).fIndex = XVar4 + 1;
            (this->fAnnotationBuf).fBuffer[XVar4] = L'&';
            chars_00 = L"lt";
LAB_0033a285:
            XMLBuffer::append(pXVar5,chars_00);
            XVar4 = (this->fAnnotationBuf).fIndex;
            XVar6 = L';';
            XVar2 = L';';
            if (XVar4 == (this->fAnnotationBuf).fCapacity) {
LAB_0033a29e:
              XVar6 = XVar2;
              XMLBuffer::ensureCapacity(pXVar5,1);
              XVar4 = pXVar5->fIndex;
            }
          }
          else {
            if (XVar6 == L'&') {
              if (XVar4 == XVar1) {
                XMLBuffer::ensureCapacity(pXVar5,1);
                XVar4 = pXVar5->fIndex;
              }
              (this->fAnnotationBuf).fIndex = XVar4 + 1;
              (this->fAnnotationBuf).fBuffer[XVar4] = L'&';
              chars_00 = L"amp";
              goto LAB_0033a285;
            }
            XVar2 = XVar6;
            if (XVar4 == XVar1) goto LAB_0033a29e;
          }
          (this->fAnnotationBuf).fIndex = XVar4 + 1;
          (this->fAnnotationBuf).fBuffer[XVar4] = XVar6;
          bVar8 = uVar7 < length;
          uVar3 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar8);
      }
    }
  }
  return;
}

Assistant:

void XSDDOMParser::docCharacters(  const   XMLCh* const    chars
                              , const XMLSize_t       length
                              , const bool            cdataSection)
{
    // Ignore chars outside of content
    if (!fWithinElement)
        return;

    if (fInnerAnnotationDepth == -1)
    {
        if (!((ReaderMgr*) fScanner->getReaderMgr())->getCurrentReader()->isAllSpaces(chars, length))
        {
            ReaderMgr::LastExtEntityInfo lastInfo;
            fScanner->getReaderMgr()->getLastExtEntityInfo(lastInfo);
            fXSLocator.setValues(lastInfo.systemId, lastInfo.publicId, lastInfo.lineNumber, lastInfo.colNumber);
            fXSDErrorReporter.emitError(XMLValid::NonWSContent, XMLUni::fgValidityDomain, &fXSLocator);
        }
    }
    // when it's within either of the 2 annotation subelements, characters are
    // allowed and we need to store them.
    else if (cdataSection == true)
    {
        fAnnotationBuf.append(XMLUni::fgCDataStart);
        fAnnotationBuf.append(chars, length);
        fAnnotationBuf.append(XMLUni::fgCDataEnd);
    }
    else
    {
        for(unsigned int i = 0; i < length; i++ )
        {
            if(chars[i] == chAmpersand)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgAmp);
                fAnnotationBuf.append(chSemiColon);
            }
            else if (chars[i] == chOpenAngle)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgLT);
                fAnnotationBuf.append(chSemiColon);
            }
            else {
                fAnnotationBuf.append(chars[i]);
            }
        }
    }
}